

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

int recip_estimate(int input)

{
  if ((input & 0xffffff00U) == 0x100) {
    return (int)(0x80000 / (ulong)(input * 2 + 1)) + 1U >> 1;
  }
  __assert_fail("256 <= input && input < 512",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                ,0x283,"int recip_estimate(int)");
}

Assistant:

static int recip_estimate(int input)
{
    int a, b, r;
    assert(256 <= input && input < 512);
    a = (input * 2) + 1;
    b = (1 << 19) / a;
    r = (b + 1) >> 1;
    assert(256 <= r && r < 512);
    return r;
}